

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListEGL.cpp
# Opt level: O0

void glcts::getConfigListEGL(Platform *platform,ApiType type,ConfigList *configList)

{
  bad_cast *anon_var_0;
  ConfigList *configList_local;
  Platform *platform_local;
  ApiType type_local;
  
  getDefaultEglConfigList(platform,type,configList);
  return;
}

Assistant:

void getConfigListEGL(tcu::Platform& platform, glu::ApiType type, ConfigList& configList)
{
	try
	{
		getDefaultEglConfigList(platform, type, configList);
	}
	catch (const std::bad_cast&)
	{
		throw tcu::Exception("Platform is not tcu::EglPlatform");
	}
}